

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::DoRecursiveVMAPAssignment
          (LWOImporter *this,VMapEntry *base,uint numRead,uint idx,float *data)

{
  Layer *pLVar1;
  ulong uVar2;
  DeadlyImportError *this_00;
  ulong __n;
  reference rVar3;
  allocator local_59;
  LWOImporter *local_58;
  string local_50;
  
  local_58 = this;
  if (data == (float *)0x0) {
    __assert_fail("__null != data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                  ,0x3bf,
                  "void Assimp::LWOImporter::DoRecursiveVMAPAssignment(VMapEntry *, unsigned int, unsigned int, float *)"
                 );
  }
  do {
    __n = (ulong)idx;
    if ((ulong)(base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= __n) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_50,"Bad index",&local_59);
      DeadlyImportError::DeadlyImportError(this_00,&local_50);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pLVar1 = local_58->mCurLayer;
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&base->abAssigned,__n);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    for (uVar2 = 0; numRead != uVar2; uVar2 = uVar2 + 1) {
      (base->rawData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[base->dims * idx + (int)uVar2] = data[uVar2];
    }
    idx = (pLVar1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[__n];
  } while (idx != 0xffffffff);
  return;
}

Assistant:

inline void LWOImporter::DoRecursiveVMAPAssignment(VMapEntry* base, unsigned int numRead,
    unsigned int idx, float* data)
{
    ai_assert(NULL != data);
    LWO::ReferrerList& refList  = mCurLayer->mPointReferrers;
    unsigned int i;

    if (idx >= base->abAssigned.size()) {
        throw DeadlyImportError("Bad index");
    }
    base->abAssigned[idx] = true;
    for (i = 0; i < numRead;++i) {
        base->rawData[idx*base->dims+i]= data[i];
    }

    if (UINT_MAX != (i = refList[idx])) {
        DoRecursiveVMAPAssignment(base,numRead,i,data);
    }
}